

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

vector<Token,_std::allocator<Token>_> *
Tokenizer::tokenize(vector<Token,_std::allocator<Token>_> *__return_storage_ptr__,string *str,
                   NumberType *numberType)

{
  pointer pTVar1;
  TokenType TVar2;
  char cVar3;
  int iVar4;
  size_type sVar5;
  ulong uVar6;
  char current;
  ulong local_d0;
  NumberType *local_c8;
  string identifier;
  Token local_a0;
  string local_50;
  
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = 0;
  local_c8 = numberType;
  do {
    if (str->_M_string_length <= uVar6) {
      return __return_storage_ptr__;
    }
    cVar3 = (str->_M_dataplus)._M_p[uVar6];
    current = cVar3;
    local_d0 = uVar6;
    iVar4 = isspace((int)cVar3);
    if (iVar4 == 0) {
      if (cVar3 == ',') {
        Token::Token(&local_a0,COMMA);
        std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                  (__return_storage_ptr__,&local_a0);
      }
      else if (cVar3 == ')') {
        Token::Token(&local_a0,RIGHT_PARENTHESIS);
        std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                  (__return_storage_ptr__,&local_a0);
      }
      else if (cVar3 == '(') {
        Token::Token(&local_a0,LEFT_PARENTHESIS);
        std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                  (__return_storage_ptr__,&local_a0);
      }
      else {
        iVar4 = (*local_c8->_vptr_NumberType[5])(local_c8,str,(ulong)(uint)(int)cVar3,uVar6);
        cVar3 = current;
        if ((char)iVar4 == '\0') {
          iVar4 = isalpha((int)current);
          if (iVar4 != 0) {
            identifier._M_dataplus._M_p = (pointer)&identifier.field_2;
            identifier.field_2._M_local_buf[0] = cVar3;
            identifier._M_string_length = 1;
            identifier.field_2._M_local_buf[1] = '\0';
            while (uVar6 = local_d0 + 1, uVar6 < str->_M_string_length) {
              current = (str->_M_dataplus)._M_p[uVar6];
              if (9 < (int)current - 0x30U) {
                iVar4 = isalpha((int)current);
                if (iVar4 == 0) break;
              }
              std::__cxx11::string::push_back((char)&identifier);
              local_d0 = uVar6;
            }
            std::__cxx11::string::string((string *)&local_50,(string *)&identifier);
            Token::Token(&local_a0,&local_50);
            std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                      (__return_storage_ptr__,&local_a0);
            Token::~Token(&local_a0);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&identifier);
            goto LAB_0012ede3;
          }
          pTVar1 = (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          if (pTVar1 != (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>).
                        _M_impl.super__Vector_impl_data._M_start) {
            TVar2 = Token::type(pTVar1 + -1);
            if (TVar2 == OPERATOR) {
              local_a0.mType =
                   Token::charValue((__return_storage_ptr__->
                                    super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + -1);
              sVar5 = std::
                      _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      ::count((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               *)(anonymous_namespace)::twoCharOps,(key_type_conflict *)&local_a0);
              if (sVar5 != 0) {
                cVar3 = Token::charValue((__return_storage_ptr__->
                                         super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                                         super__Vector_impl_data._M_finish + -1);
                Token::Token(&local_a0,TWO_CHAR_OPERATOR,cVar3,current);
                Token::operator=((__return_storage_ptr__->
                                 super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                                 super__Vector_impl_data._M_finish + -1,&local_a0);
                goto LAB_0012eddb;
              }
            }
          }
          Token::Token(&local_a0,OPERATOR,current);
          std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                    (__return_storage_ptr__,&local_a0);
        }
        else {
          (*local_c8->_vptr_NumberType[6])(&local_a0,local_c8,str,&current,&local_d0);
          std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                    (__return_storage_ptr__,&local_a0);
        }
      }
LAB_0012eddb:
      Token::~Token(&local_a0);
    }
LAB_0012ede3:
    uVar6 = local_d0 + 1;
  } while( true );
}

Assistant:

std::vector<Token> Tokenizer::tokenize(std::string str, NumberType& numberType) {
	std::vector<Token> tokens;
	for (std::size_t i = 0; i < str.size(); i++) {
		char current = str[i];

		//Skip whitespaces
		if (isspace(current)) {
			continue;
		}

		//Parenthesis
		if (current == '(') {
			tokens.push_back({ TokenType::LEFT_PARENTHESIS });
			continue;
		}

		if (current == ')') {
			tokens.push_back({ TokenType::RIGHT_PARENTHESIS });
			continue;
		}

		//Comma
		if (current == ',') {
			tokens.push_back({ TokenType::COMMA });
			continue;
		}

		//Number
		if (numberType.isStartOfNumber(str, current, i)) {
			tokens.push_back(numberType.parseNumber(str, current, i));
			continue;
		}

		//Identifier
		if (isalpha(current)) {
			std::string identifier { current };

			while (true) {
				std::size_t next = i + 1;

				if (next >= str.size()) {
					break;
				}

				current = str[next];

				if (!(isdigit(current) || isalpha(current))) {
					break;
				}

				identifier += current;
				i = next;
			}

			tokens.push_back(Token(identifier));
			continue;
		}

		//Operator
		if (tokens.size() > 0 && tokens.back().type() == TokenType::OPERATOR
			&& twoCharOps.count(tokens.back().charValue()) > 0) {
			//If the previous token is an operator and the current one also is, upgrade to a two-op char
			tokens.back() = { TokenType::TWO_CHAR_OPERATOR, tokens.back().charValue(), current };
		} else {
			tokens.push_back({ TokenType::OPERATOR, current });
		}
	}

	return tokens;
}